

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.h
# Opt level: O2

void __thiscall
mvm::
interpreter<mvm::test::test_instr_set_mixed,_mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,_mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<double,_unsigned_int>_>_>_>_>
::run(interpreter<mvm::test::test_instr_set_mixed,_mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,_mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<double,_unsigned_int>_>_>_>_>
      *this)

{
  byte *pbVar1;
  
  pbVar1 = (byte *)(this->m_rebased_ip).super_ip.m_val;
  if (((byte *)(this->m_rebased_ip).super_ip.m_base <= pbVar1) &&
     (pbVar1 <= (byte *)(this->m_rebased_ip).m_max)) {
    (*(code *)(&DAT_00150d44 + *(int *)(&DAT_00150d44 + (ulong)*pbVar1 * 4)))();
    return;
  }
  return;
}

Assistant:

void interpreter<Set, InstancesList>::run() {
  while (m_rebased_ip.assert_in_chunk()) {
    LOG_INFO("interpreter -> process instruction opcode "
             << static_cast<int>(*m_rebased_ip));

#ifdef FASTI
#define MVM_INTERPRETER_I(n)                                                   \
  case n: {                                                                    \
    using instr_type = list::at_t<n, instr_set_desc_type>;                     \
    if constexpr (!std::is_same_v<instr_type, nonsuch>) {                      \
      this->interpret_instr<instr_type>();                                     \
    } else {                                                                   \
      throw mexcept("[-][mvm] invalid instruction opcode",                     \
                    status_type::INVALID_INSTR_OPCODE);                        \
    }                                                                          \
  } break;
    switch (*m_rebased_ip) {
      MVM_UNROLL_256(MVM_INTERPRETER_I)
    default:
      throw mexcept("[-][mvm] instruction opcode overflow",
                    status_type::INSTR_OPCODE_OVERFLOW);
    }
#else
    instr_set_visitor<instr_set_desc_type>()(*m_rebased_ip, [this](auto &&arg) {
      using instr_type = std::decay_t<decltype(arg)>;
      LOG_INFO("interpreter -> process instruction "
               << typestring::char_seq<typename instr_type::name_type>::value);
      this->interpret_instr<instr_type>();
    });
#endif
  }
}